

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::BeginSweep
          (RecyclerSweep *this,Recycler *recycler,RecyclerSweepManager *recyclerSweepManager,
          HeapInfo *heapInfo)

{
  HeapInfo *heapInfo_local;
  RecyclerSweepManager *recyclerSweepManager_local;
  Recycler *recycler_local;
  RecyclerSweep *this_local;
  
  this->recycler = recycler;
  this->recyclerSweepManager = recyclerSweepManager;
  this->heapInfo = heapInfo;
  FlushPendingTransferDisposedObjects(this);
  (this->leafData).pendingMergeNewHeapBlockList = heapInfo->newLeafHeapBlockList;
  (this->normalData).pendingMergeNewHeapBlockList = heapInfo->newNormalHeapBlockList;
  (this->withBarrierData).pendingMergeNewHeapBlockList = heapInfo->newNormalWithBarrierHeapBlockList
  ;
  (this->finalizableWithBarrierData).pendingMergeNewHeapBlockList =
       heapInfo->newFinalizableWithBarrierHeapBlockList;
  (this->finalizableData).pendingMergeNewHeapBlockList = heapInfo->newFinalizableHeapBlockList;
  (this->mediumLeafData).pendingMergeNewHeapBlockList = heapInfo->newMediumLeafHeapBlockList;
  (this->mediumNormalData).pendingMergeNewHeapBlockList = heapInfo->newMediumNormalHeapBlockList;
  (this->mediumWithBarrierData).pendingMergeNewHeapBlockList =
       heapInfo->newMediumNormalWithBarrierHeapBlockList;
  (this->mediumFinalizableWithBarrierData).pendingMergeNewHeapBlockList =
       heapInfo->newMediumFinalizableWithBarrierHeapBlockList;
  (this->mediumFinalizableData).pendingMergeNewHeapBlockList =
       heapInfo->newMediumFinalizableHeapBlockList;
  heapInfo->newLeafHeapBlockList = (SmallLeafHeapBlock *)0x0;
  heapInfo->newNormalHeapBlockList = (SmallNormalHeapBlock *)0x0;
  heapInfo->newFinalizableHeapBlockList = (SmallFinalizableHeapBlock *)0x0;
  heapInfo->newNormalWithBarrierHeapBlockList = (SmallNormalWithBarrierHeapBlock *)0x0;
  heapInfo->newFinalizableWithBarrierHeapBlockList = (SmallFinalizableWithBarrierHeapBlock *)0x0;
  heapInfo->newMediumLeafHeapBlockList = (MediumLeafHeapBlock *)0x0;
  heapInfo->newMediumNormalHeapBlockList = (MediumNormalHeapBlock *)0x0;
  heapInfo->newMediumFinalizableHeapBlockList = (MediumFinalizableHeapBlock *)0x0;
  heapInfo->newMediumNormalWithBarrierHeapBlockList = (MediumNormalWithBarrierHeapBlock *)0x0;
  heapInfo->newMediumFinalizableWithBarrierHeapBlockList =
       (MediumFinalizableWithBarrierHeapBlock *)0x0;
  return;
}

Assistant:

void
RecyclerSweep::BeginSweep(Recycler * recycler, RecyclerSweepManager * recyclerSweepManager, HeapInfo * heapInfo)
{
    // RecyclerSweep may not be initialized till later in this function but
    // GCETW relies on the recycler pointer being correctly set up
    this->recycler = recycler;
    this->recyclerSweepManager = recyclerSweepManager;
    this->heapInfo = heapInfo;


    // We might still have block that has disposed but not put back into the allocable
    // heap block list yet, which happens if we finish disposing object during concurrent
    // reset mark and can't
    // modify the heap block lists

    // CONCURRENT-TODO: Consider doing it during FinishDisposeObjects to get these block
    // available sooner as well. We will still need it here as we only always get to
    // finish dispose before sweep.
    this->FlushPendingTransferDisposedObjects();

#if ENABLE_CONCURRENT_GC
    // Take the small heap block new heap block list and store in RecyclerSweep temporary
    // We get merge later before we start sweeping the bucket.

    leafData.pendingMergeNewHeapBlockList = heapInfo->newLeafHeapBlockList;
    normalData.pendingMergeNewHeapBlockList = heapInfo->newNormalHeapBlockList;
#ifdef RECYCLER_WRITE_BARRIER
    withBarrierData.pendingMergeNewHeapBlockList = heapInfo->newNormalWithBarrierHeapBlockList;
    finalizableWithBarrierData.pendingMergeNewHeapBlockList = heapInfo->newFinalizableWithBarrierHeapBlockList;
#endif
    finalizableData.pendingMergeNewHeapBlockList = heapInfo->newFinalizableHeapBlockList;
#ifdef RECYCLER_VISITED_HOST
    recyclerVisitedHostData.pendingMergeNewHeapBlockList = heapInfo->newRecyclerVisitedHostHeapBlockList;
#endif

    mediumLeafData.pendingMergeNewHeapBlockList = heapInfo->newMediumLeafHeapBlockList;
    mediumNormalData.pendingMergeNewHeapBlockList = heapInfo->newMediumNormalHeapBlockList;
#ifdef RECYCLER_WRITE_BARRIER
    mediumWithBarrierData.pendingMergeNewHeapBlockList = heapInfo->newMediumNormalWithBarrierHeapBlockList;
    mediumFinalizableWithBarrierData.pendingMergeNewHeapBlockList = heapInfo->newMediumFinalizableWithBarrierHeapBlockList;
#endif
    mediumFinalizableData.pendingMergeNewHeapBlockList = heapInfo->newMediumFinalizableHeapBlockList;
#ifdef RECYCLER_VISITED_HOST
    mediumRecyclerVisitedHostData.pendingMergeNewHeapBlockList = heapInfo->newMediumRecyclerVisitedHostHeapBlockList;
#endif


    heapInfo->newLeafHeapBlockList = nullptr;
    heapInfo->newNormalHeapBlockList = nullptr;
    heapInfo->newFinalizableHeapBlockList = nullptr;
#ifdef RECYCLER_VISITED_HOST
    heapInfo->newRecyclerVisitedHostHeapBlockList = nullptr;
#endif
#ifdef RECYCLER_WRITE_BARRIER
    heapInfo->newNormalWithBarrierHeapBlockList = nullptr;
    heapInfo->newFinalizableWithBarrierHeapBlockList = nullptr;
#endif

    heapInfo->newMediumLeafHeapBlockList = nullptr;
    heapInfo->newMediumNormalHeapBlockList = nullptr;
    heapInfo->newMediumFinalizableHeapBlockList = nullptr;
#ifdef RECYCLER_VISITED_HOST
    heapInfo->newMediumRecyclerVisitedHostHeapBlockList = nullptr;
#endif
#ifdef RECYCLER_WRITE_BARRIER
    heapInfo->newMediumNormalWithBarrierHeapBlockList = nullptr;
    heapInfo->newMediumFinalizableWithBarrierHeapBlockList = nullptr;
#endif

#endif
}